

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O0

int XUtf8Tolower(int ucs)

{
  int ret;
  int ucs_local;
  
  if (ucs < 0x2b7) {
    if ((ucs < 0x41) || (ret = (int)ucs_table_0041[ucs + -0x41], ret == 0)) {
      ret = ucs;
    }
  }
  else if (ucs < 0x557) {
    if ((ucs < 0x386) || (ret = (int)ucs_table_0386[ucs + -0x386], ret == 0)) {
      ret = ucs;
    }
  }
  else if (ucs < 0x10c6) {
    if ((ucs < 0x10a0) || (ret = (int)ucs_table_10A0[ucs + -0x10a0], ret == 0)) {
      ret = ucs;
    }
  }
  else if (ucs < 0x1ffd) {
    if ((ucs < 0x1e00) || (ret = (int)ucs_table_1E00[ucs + -0x1e00], ret == 0)) {
      ret = ucs;
    }
  }
  else if (ucs < 0x2134) {
    if ((ucs < 0x2102) || (ret = (int)ucs_table_2102[ucs + -0x2102], ret == 0)) {
      ret = ucs;
    }
  }
  else if (ucs < 0x24d0) {
    if ((ucs < 0x24b6) || (ret = (int)ucs_table_24B6[ucs + -0x24b6], ret == 0)) {
      ret = ucs;
    }
  }
  else if (ucs < 0x33cf) {
    if ((ucs < 0x33ce) || (ret = (int)ucs_table_33CE[ucs + -0x33ce], ret == 0)) {
      ret = ucs;
    }
  }
  else {
    ret = ucs;
    if ((ucs < 0xff3b) && ((ucs < 0xff21 || (ret = (int)ucs_table_FF21[ucs + -0xff21], ret == 0))))
    {
      ret = ucs;
    }
  }
  return ret;
}

Assistant:

int 
XUtf8Tolower(int ucs) {
  int ret;
  if (ucs <= 0x02B6) {
    if (ucs >= 0x0041) {
      ret = ucs_table_0041[ucs - 0x0041];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x0556) {
    if (ucs >= 0x0386) {
      ret = ucs_table_0386[ucs - 0x0386];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x10C5) {
    if (ucs >= 0x10A0) {
      ret = ucs_table_10A0[ucs - 0x10A0];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x1FFC) {
    if (ucs >= 0x1E00) {
      ret = ucs_table_1E00[ucs - 0x1E00];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x2133) {
    if (ucs >= 0x2102) {
      ret = ucs_table_2102[ucs - 0x2102];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x24CF) {
    if (ucs >= 0x24B6) {
      ret = ucs_table_24B6[ucs - 0x24B6];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0x33CE) {
    if (ucs >= 0x33CE) {
      ret = ucs_table_33CE[ucs - 0x33CE];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  if (ucs <= 0xFF3A) {
    if (ucs >= 0xFF21) {
      ret = ucs_table_FF21[ucs - 0xFF21];
      if (ret > 0) return ret;
    }
    return ucs;
  }

  return ucs;
}